

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

bool __thiscall
double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  int32_t iVar1;
  uint64_t uVar2;
  ulong uVar3;
  byte bVar4;
  undefined4 in_register_0000000c;
  double *number_of_read_digits;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  DiyFp diy_fp;
  DiyFp local_68;
  int cached_decimal_exponent;
  DiyFp cached_power;
  DiyFp local_40;
  
  number_of_read_digits = (double *)CONCAT44(in_register_0000000c,exponent);
  uVar8 = (uint)trimmed.start_;
  if (uVar8 == 0) goto LAB_0051e99a;
  uVar5 = trimmed.length_;
  if (0x135 < (int)(uVar5 + uVar8)) {
    *number_of_read_digits = INFINITY;
    return true;
  }
  if ((int)(uVar5 + uVar8) < -0x143) goto LAB_0051e99a;
  if (0xf < (int)uVar8) goto LAB_0051e930;
  if (0xffffffe9 < uVar5) {
    buffer.start_ = (char *)(ulong)uVar8;
    buffer._8_8_ = &local_68;
    uVar2 = ReadUint64(this,buffer,(int *)number_of_read_digits);
    auVar14._8_4_ = (int)(uVar2 >> 0x20);
    auVar14._0_8_ = uVar2;
    auVar14._12_4_ = 0x45300000;
    dVar13 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
             *(double *)(exact_powers_of_ten + (ulong)-uVar5 * 8);
    goto LAB_0051e92a;
  }
  if (uVar5 < 0x17) {
    buffer_00.start_ = (char *)(ulong)uVar8;
    buffer_00._8_8_ = &local_68;
    uVar2 = ReadUint64(this,buffer_00,(int *)number_of_read_digits);
    auVar15._8_4_ = (int)(uVar2 >> 0x20);
    auVar15._0_8_ = uVar2;
    auVar15._12_4_ = 0x45300000;
    dVar13 = (auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    uVar3 = (ulong)uVar5;
LAB_0051e925:
    dVar13 = dVar13 * *(double *)(exact_powers_of_ten + uVar3 * 8);
LAB_0051e92a:
    *number_of_read_digits = dVar13;
    return true;
  }
  if (-1 < (int)uVar5) {
    iVar7 = uVar5 - (0xf - uVar8);
    if (iVar7 < 0x17) {
      buffer_01.start_ = (char *)(ulong)uVar8;
      buffer_01._8_8_ = &local_68;
      uVar2 = ReadUint64(this,buffer_01,(int *)number_of_read_digits);
      auVar16._8_4_ = (int)(uVar2 >> 0x20);
      auVar16._0_8_ = uVar2;
      auVar16._12_4_ = 0x45300000;
      dVar13 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) *
               *(double *)(exact_powers_of_ten + (ulong)(0xf - uVar8) * 8);
      uVar3 = (ulong)iVar7;
      goto LAB_0051e925;
    }
  }
LAB_0051e930:
  buffer_02.start_ = (char *)(ulong)uVar8;
  buffer_02._8_8_ = &cached_power;
  local_68.f_ = ReadUint64(this,buffer_02,(int *)number_of_read_digits);
  if (uVar8 == (uint)cached_power.f_) {
    iVar7 = 0;
  }
  else {
    local_68.f_ = local_68.f_ + ('4' < (char)this[(int)(uint)cached_power.f_]);
    iVar7 = uVar8 - (uint)cached_power.f_;
  }
  local_68.e_ = 0;
  iVar10 = uVar5 + iVar7;
  DiyFp::Normalize(&local_68);
  lVar9 = ((ulong)(iVar7 != 0) << 2) << (-(char)local_68.e_ & 0x3fU);
  if (-0x15d < iVar10) {
    cached_power.f_ = 0;
    cached_power.e_ = 0;
    PowersOfTenCache::GetCachedPowerForDecimalExponent
              (iVar10,&cached_power,&cached_decimal_exponent);
    iVar10 = iVar10 - cached_decimal_exponent;
    if (iVar10 != 0) {
      uVar5 = iVar10 - 1;
      if (6 < uVar5) {
        abort();
      }
      local_40.e_ = *(int32_t *)(&DAT_02dfab88 + (ulong)uVar5 * 4);
      local_40.f_ = *(uint64_t *)(&DAT_02dfaba8 + (ulong)uVar5 * 8);
      DiyFp::Multiply(&local_68,&local_40);
      if ((int)(0x13 - uVar8) < iVar10) {
        lVar9 = lVar9 + 4;
      }
    }
    DiyFp::Multiply(&local_68,&cached_power);
    iVar1 = local_68.e_;
    DiyFp::Normalize(&local_68);
    uVar12 = (9 - (ulong)(lVar9 == 0)) + lVar9 << ((char)iVar1 - (char)local_68.e_ & 0x3fU);
    uVar3 = 0;
    if (0xfffffbce < local_68.e_ + 0x40U) {
      uVar3 = (ulong)(local_68.e_ + 0x472);
    }
    uVar6 = 0x35;
    if (local_68.e_ < -0x43d) {
      uVar6 = uVar3;
    }
    iVar7 = (int)uVar6;
    if (iVar7 < 4) {
      bVar4 = (byte)(4 - iVar7);
      local_68.f_ = local_68.f_ >> (bVar4 & 0x3f);
      local_68.e_ = (4 - iVar7) + local_68.e_;
      uVar6 = (ulong)(uint)local_68.e_;
      uVar12 = (uVar12 >> (bVar4 & 0x3f)) + 9;
      iVar7 = 0x3c;
    }
    else {
      iVar7 = 0x40 - iVar7;
    }
    bVar4 = (byte)iVar7;
    uVar11 = (~(-1L << (bVar4 & 0x3f)) & local_68.f_) << 3;
    lVar9 = 8L << (bVar4 - 1 & 0x3f);
    diy_fp.f_ = (ulong)(uint)(local_68.e_ + iVar7);
    uVar3 = uVar12 + lVar9;
    diy_fp._8_8_ = uVar6;
    dVar13 = (double)Double::DiyFpToUint64
                               ((Double *)
                                (((local_68.f_ >> (bVar4 & 0x3f)) + 1) - (ulong)(uVar11 < uVar3)),
                                diy_fp);
    *number_of_read_digits = dVar13;
    if (lVar9 - uVar12 < uVar11) {
      if (uVar11 < uVar3) {
        return INFINITY <= dVar13;
      }
      return true;
    }
    return true;
  }
LAB_0051e99a:
  *number_of_read_digits = 0.0;
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}